

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_tests.cpp
# Opt level: O2

void __thiscall
test::iu_NoFailureTest_x_iutest_x_Inform_Test::Body(iu_NoFailureTest_x_iutest_x_Inform_Test *this)

{
  int iVar1;
  iuCodeMessage local_1e0;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker_1;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker);
  iVar1 = iutest_failure_checker.m_count;
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker.m_holder);
  if (0 < iVar1) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x4e,"\nExpected: ; doesn\'t generate new failure.\n  Actual: it does.");
    local_1e0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker_1);
  memset(&iutest_failure_checker,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&iutest_failure_checker);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
             ,0x4f,"Succeeded.\n");
  local_1e0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker)
  ;
  std::__cxx11::string::~string((string *)&local_1e0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&iutest_failure_checker);
  iVar1 = iutest_failure_checker_1.m_count;
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker_1.m_holder);
  if (0 < iVar1) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x4f,
               "\nExpected: ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 79, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed() doesn\'t generate new failure.\n  Actual: it does."
              );
    local_1e0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker);
  NoFatalFailureTest_Subroutine();
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker.m_holder);
  if (0 < iutest_failure_checker.m_count) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x50,
               "\nExpected: NoFatalFailureTest_Subroutine() doesn\'t generate new failure.\n  Actual: it does."
              );
    local_1e0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker_1);
  memset(&iutest_failure_checker,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&iutest_failure_checker);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
             ,0x51,"Succeeded.\n");
  local_1e0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker)
  ;
  std::__cxx11::string::~string((string *)&local_1e0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&iutest_failure_checker);
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker_1.m_holder);
  if (0 < iutest_failure_checker_1.m_count) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp"
               ,0x51,
               "\nExpected: { ::iutest::AssertionHelper(\"/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_tests.cpp\", 81, \"Succeeded.\\n\", ::iutest::TestPartResult::kSuccess) = ::iutest::AssertionHelper::Fixed(); } doesn\'t generate new failure.\n  Actual: it does."
              );
    local_1e0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1e0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  return;
}

Assistant:

IUTEST(NoFailureTest, Inform)
{
    IUTEST_INFORM_NO_FAILURE(;);
    IUTEST_INFORM_NO_FAILURE(IUTEST_SUCCEED());
    IUTEST_INFORM_NO_FAILURE(NoFatalFailureTest_Subroutine());
    IUTEST_INFORM_NO_FAILURE({ IUTEST_SUCCEED(); });
}